

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::decoder_strategy>::
read_restart_marker(jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::decoder_strategy>
                    *this)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  pbVar3 = (this->super_decoder_strategy).position_;
  pbVar2 = (this->super_decoder_strategy).end_position_;
  if (pbVar3 == pbVar2) {
LAB_0011b58f:
    jls_codec<charls::lossless_traits<unsigned_short,16>,charls::decoder_strategy>::
    read_restart_marker();
  }
  else {
    bVar1 = *pbVar3;
    pbVar3 = pbVar3 + 1;
    (this->super_decoder_strategy).position_ = pbVar3;
    if (bVar1 == 0xff) {
      do {
        if (pbVar3 == pbVar2) {
          jls_codec<charls::lossless_traits<unsigned_short,16>,charls::decoder_strategy>::
          read_restart_marker();
          goto LAB_0011b58f;
        }
        bVar1 = *pbVar3;
        pbVar3 = pbVar3 + 1;
        (this->super_decoder_strategy).position_ = pbVar3;
      } while (bVar1 == 0xff);
      if (this->restart_interval_counter_ + 0xd0 == (uint)bVar1) {
        return;
      }
      goto LAB_0011b599;
    }
  }
  jls_codec<charls::lossless_traits<unsigned_short,16>,charls::decoder_strategy>::
  read_restart_marker();
LAB_0011b599:
  jls_codec<charls::lossless_traits<unsigned_short,16>,charls::decoder_strategy>::
  read_restart_marker();
}

Assistant:

void read_restart_marker()
    {
        auto byte{Strategy::read_byte()};
        if (UNLIKELY(byte != jpeg_marker_start_byte))
            impl::throw_jpegls_error(jpegls_errc::restart_marker_not_found);

        // Read all preceding 0xFF fill values until a non 0xFF value has been found. (see T.81, B.1.1.2)
        do
        {
            byte = Strategy::read_byte();
        } while (byte == jpeg_marker_start_byte);

        if (UNLIKELY(byte != jpeg_restart_marker_base + restart_interval_counter_))
            impl::throw_jpegls_error(jpegls_errc::restart_marker_not_found);
    }